

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DaTrie<false,_false,_false>::excheck_
          (DaTrie<false,_false,_false> *this,Edge *edge,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  byte *pbVar4;
  Edge *in_RSI;
  long in_RDI;
  uint32_t unaff_retaddr;
  DaTrie<false,_false,_false> *in_stack_00000008;
  uint32_t base;
  uint32_t node_pos;
  uint32_t upper_limit;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)(in_RDI + 0x60) != -1) {
    uVar2 = bc_size((DaTrie<false,_false,_false> *)0x1555da);
    local_28 = *(uint *)(in_RDI + 0x60);
    do {
      if (local_28 < uVar2 - 0x100) {
        in_stack_ffffffffffffffc4 = local_28;
        pbVar4 = Edge::begin(in_RSI);
        uVar3 = in_stack_ffffffffffffffc4 ^ *pbVar4;
        bVar1 = is_target_ex_(in_stack_00000008,unaff_retaddr,
                              (Edge *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
        ;
        if (bVar1) {
          *(uint *)(in_RDI + 0x60) = local_28;
          return uVar3;
        }
      }
      local_28 = next_((DaTrie<false,_false,_false> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
    } while (local_28 != *(uint32_t *)(in_RDI + 0x60));
  }
  return 0xffffffff;
}

Assistant:

uint32_t excheck_(const Edge& edge, const std::vector<Block>& blocks) {
    if (head_pos_ == NOT_FOUND) {
      return NOT_FOUND;
    }

    auto upper_limit = bc_size() - BLOCK_SIZE;
    auto node_pos = head_pos_;

    do {
      if (upper_limit <= node_pos) {
        continue;
      }
      auto base = node_pos ^*edge.begin();
      if (is_target_ex_(base, edge)) {
        head_pos_ = node_pos; // update for remaining
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head_pos_);

    return NOT_FOUND;
  }